

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEndWhileCommand.cxx
# Opt level: O1

bool __thiscall
cmEndWhileCommand::InvokeInitialPass
          (cmEndWhileCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *param_2)

{
  string local_30;
  
  if ((args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
      super__Vector_impl_data._M_start ==
      (args->super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>)._M_impl.
      super__Vector_impl_data._M_finish) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,
               "An ENDWHILE command was found outside of a proper WHILE ENDWHILE structure.","");
    cmCommand::SetError(&this->super_cmCommand,&local_30);
  }
  else {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_30,
               "An ENDWHILE command was found outside of a proper WHILE ENDWHILE structure. Or its arguments did not match the opening WHILE command."
               ,"");
    cmCommand::SetError(&this->super_cmCommand,&local_30);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool cmEndWhileCommand
::InvokeInitialPass(std::vector<cmListFileArgument> const& args,
                    cmExecutionStatus &)
{
  if (args.empty())
    {
    this->SetError("An ENDWHILE command was found outside of a proper "
                   "WHILE ENDWHILE structure.");
    }
  else
    {
    this->SetError("An ENDWHILE command was found outside of a proper "
                   "WHILE ENDWHILE structure. Or its arguments did not "
                   "match the opening WHILE command.");
    }

  return false;
}